

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inc_search_demo.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  SquareCell sstate;
  SquareCell sstate_00;
  SquareCell gstate;
  SquareCell gstate_00;
  CalcHeuristicFunc_t<SquareCell,_double> calc_heuristic;
  GetNeighbourFunc_t<SquareCell,_double> get_neighbours;
  GetNeighbourFunc_t<SquareCell,_double> get_neighbours_00;
  ostream *poVar1;
  SquareCell *e_1;
  SquareCell *e;
  pointer pSVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> obstacle_ids;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> sgraph1;
  Path<SquareCell> path2;
  Path<SquareCell> path;
  GetSquareCellNeighbour find_neighbours;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> sgraph2;
  pointer puVar3;
  iterator __position;
  _Manager_type p_Var4;
  _Invoker_type in_stack_fffffffffffffe10;
  code *pcVar5;
  undefined8 uVar6;
  code *pcVar7;
  code *pcVar8;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> local_1c8;
  int64_t local_188;
  int64_t iStack_180;
  int64_t local_178;
  Path<SquareCell> local_170;
  int64_t local_158;
  int64_t iStack_150;
  int64_t local_148;
  Path<SquareCell> local_140;
  undefined1 local_128 [48];
  code *local_f8;
  int64_t local_e8;
  int64_t iStack_e0;
  int64_t local_d8;
  int64_t local_c8;
  int64_t iStack_c0;
  int64_t local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  GetSquareCellNeighbour local_90;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> local_68;
  
  puVar3 = (pointer)0x0;
  __position._M_current = (unsigned_long *)0x0;
  p_Var4 = (_Manager_type)0x0;
  local_1c8._0_8_ = 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xfffffffffffffdf8,
             (iterator)0x0,(unsigned_long *)&local_1c8);
  local_1c8._0_8_ = 6;
  if ((_Manager_type)__position._M_current == p_Var4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xfffffffffffffdf8,
               __position,(unsigned_long *)&local_1c8);
  }
  else {
    *__position._M_current = 6;
    __position._M_current = __position._M_current + 1;
  }
  local_1c8._0_8_ = 7;
  if ((_Manager_type)__position._M_current == p_Var4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xfffffffffffffdf8,
               __position,(unsigned_long *)&local_1c8);
  }
  else {
    *__position._M_current = 7;
    __position._M_current = __position._M_current + 1;
  }
  local_1c8._0_8_ = 0x11;
  if ((_Manager_type)__position._M_current == p_Var4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xfffffffffffffdf8,
               __position,(unsigned_long *)&local_1c8);
  }
  else {
    *__position._M_current = 0x11;
    __position._M_current = __position._M_current + 1;
  }
  local_1c8._0_8_ = 0x12;
  if ((_Manager_type)__position._M_current == p_Var4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xfffffffffffffdf8,
               __position,(unsigned_long *)&local_1c8);
  }
  else {
    *__position._M_current = 0x12;
    __position._M_current = __position._M_current + 1;
  }
  local_1c8._0_8_ = 0x13;
  if ((_Manager_type)__position._M_current == p_Var4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xfffffffffffffdf8,
               __position,(unsigned_long *)&local_1c8);
  }
  else {
    *__position._M_current = 0x13;
    __position._M_current = __position._M_current + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xfffffffffffffdf8);
  local_90.row_size_ = 5;
  local_90.col_size_ = 5;
  local_90.cell_size_ = 1.0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_90.obstacle_ids_,&local_a8);
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_1c8.vertex_map_._M_h._M_buckets = &local_1c8.vertex_map_._M_h._M_single_bucket;
  local_1c8.vertex_map_._M_h._M_bucket_count = 1;
  local_1c8.vertex_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1c8.vertex_map_._M_h._M_element_count = 0;
  local_1c8.vertex_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1c8.vertex_map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_1c8.vertex_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_c8 = 0;
  iStack_c0 = 0;
  local_b8 = 0;
  local_158 = 4;
  iStack_150 = 4;
  local_148 = 0x18;
  uVar6 = (__buckets_ptr)0x0;
  pcVar5 = CalcHeuristic;
  pcVar8 = std::
           _Function_handler<double_(SquareCell,_SquareCell),_double_(*)(SquareCell,_SquareCell)>::
           _M_invoke;
  pcVar7 = std::
           _Function_handler<double_(SquareCell,_SquareCell),_double_(*)(SquareCell,_SquareCell)>::
           _M_manager;
  std::
  function<std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>(SquareCell)>
  ::function<GetSquareCellNeighbour&,void>
            ((function<std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>(SquareCell)>
              *)(local_128 + 0x20),&local_90);
  sstate.idx.y = iStack_c0;
  sstate.idx.x = local_c8;
  sstate.id = local_b8;
  gstate.idx.y = iStack_150;
  gstate.idx.x = local_158;
  gstate.id = local_148;
  calc_heuristic.super__Function_base._M_functor._8_8_ = __position._M_current;
  calc_heuristic.super__Function_base._M_functor._M_unused._M_object = puVar3;
  calc_heuristic.super__Function_base._M_manager = p_Var4;
  calc_heuristic._M_invoker = in_stack_fffffffffffffe10;
  get_neighbours_00.super__Function_base._M_functor._8_8_ = uVar6;
  get_neighbours_00.super__Function_base._M_functor._M_unused._M_function_pointer = pcVar5;
  get_neighbours_00.super__Function_base._M_manager = pcVar7;
  get_neighbours_00._M_invoker = pcVar8;
  xmotion::AStar::IncSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
            (&local_140,(AStar *)&local_1c8,
             (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)
             &stack0xfffffffffffffe18,sstate,gstate,calc_heuristic,get_neighbours_00);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(local_128 + 0x20,local_128 + 0x20,3);
  }
  if (pcVar7 != (_Manager_type)0x0) {
    (*pcVar7)((_Any_data *)&stack0xfffffffffffffe18,(_Any_data *)&stack0xfffffffffffffe18,
              __destroy_functor);
  }
  local_68.vertex_map_._M_h._M_buckets = &local_68.vertex_map_._M_h._M_single_bucket;
  local_68.vertex_map_._M_h._M_bucket_count = 1;
  local_68.vertex_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68.vertex_map_._M_h._M_element_count = 0;
  local_68.vertex_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_68.vertex_map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_68.vertex_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = 0;
  iStack_e0 = 0;
  local_d8 = 0;
  local_188 = 4;
  iStack_180 = 4;
  local_178 = 0x18;
  std::
  function<std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>(SquareCell)>
  ::function<GetSquareCellNeighbour&,void>
            ((function<std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>(SquareCell)>
              *)local_128,&local_90);
  sstate_00.idx.y = iStack_e0;
  sstate_00.idx.x = local_e8;
  sstate_00.id = local_d8;
  gstate_00.idx.y = iStack_180;
  gstate_00.idx.x = local_188;
  gstate_00.id = local_178;
  get_neighbours.super__Function_base._M_functor._8_8_ = __position._M_current;
  get_neighbours.super__Function_base._M_functor._M_unused._M_object = puVar3;
  get_neighbours.super__Function_base._M_manager = p_Var4;
  get_neighbours._M_invoker = (_Invoker_type)in_stack_fffffffffffffe10;
  xmotion::Dijkstra::IncSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
            (&local_170,(Dijkstra *)&local_68,
             (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)local_128,sstate_00,
             gstate_00,get_neighbours);
  if ((code *)local_128._16_8_ != (code *)0x0) {
    (*(code *)local_128._16_8_)(local_128,local_128,3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"path a*: ",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  for (pSVar2 = local_140.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar2 != local_140.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
                super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"id: ",4);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"path dijkstra: ",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  for (pSVar2 = local_170.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar2 != local_170.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
                super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"id: ",4);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if (local_170.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::~Graph(&local_68);
  if (local_140.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::~Graph(&local_1c8);
  if (local_90.obstacle_ids_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.obstacle_ids_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  SquareCell cell_s(0);
  cell_s.idx.x = 0;
  cell_s.idx.y = 0;

  SquareCell cell_g(24);
  cell_g.idx.x = 4;
  cell_g.idx.y = 4;

  std::vector<uint64_t> obstacle_ids;
  obstacle_ids.push_back(5);
  obstacle_ids.push_back(6);
  obstacle_ids.push_back(7);
  obstacle_ids.push_back(17);
  obstacle_ids.push_back(18);
  obstacle_ids.push_back(19);

  auto find_neighbours = GetSquareCellNeighbour(5, 5, 1.0, obstacle_ids);

  Graph<SquareCell, double> sgraph1;
  auto path = AStar::IncSearch(&sgraph1, cell_s, cell_g,
                               CalcHeuristicFunc_t<SquareCell>(CalcHeuristic),
                               GetNeighbourFunc_t<SquareCell>(find_neighbours));

  Graph<SquareCell, double> sgraph2;
  auto path2 =
      Dijkstra::IncSearch(&sgraph2, cell_s, cell_g,
                          GetNeighbourFunc_t<SquareCell>(find_neighbours));

  std::cout << "path a*: " << std::endl;
  for (auto &e : path) std::cout << "id: " << e.id << std::endl;
  std::cout << "path dijkstra: " << std::endl;
  for (auto &e : path2) std::cout << "id: " << e.id << std::endl;

  return 0;
}